

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool cmDependsFortran::ModulesDiffer(char *modFile,char *stampFile,char *compilerId)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  bool bVar7;
  char seq [2];
  char seq_1 [1];
  ifstream finModFile;
  byte abStack_410 [488];
  ifstream finStampFile;
  uint auStack_208 [122];
  
  iVar3 = strcmp(compilerId,"SunPro");
  if (iVar3 == 0) {
    std::__cxx11::string::string((string *)&finModFile,modFile,(allocator *)seq);
    std::__cxx11::string::string((string *)&finStampFile,stampFile,(allocator *)seq_1);
    bVar7 = cmsys::SystemTools::FilesDiffer((string *)&finModFile,(string *)&finStampFile);
    std::__cxx11::string::~string((string *)&finStampFile);
    std::__cxx11::string::~string((string *)&finModFile);
    return bVar7;
  }
  std::ifstream::ifstream(&finModFile,modFile,_S_in);
  std::ifstream::ifstream(&finStampFile,stampFile,_S_in);
  bVar7 = true;
  if (((abStack_410[*(long *)(_finModFile + -0x18)] & 5) != 0) ||
     ((*(byte *)((long)auStack_208 + *(long *)(_finStampFile + -0x18)) & 5) != 0))
  goto LAB_00462de1;
  iVar3 = strcmp(compilerId,"GNU");
  if (iVar3 == 0) {
    plVar5 = (long *)std::istream::read((char *)&finModFile,(long)seq);
    uVar1 = *(uint *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
    std::istream::seekg(&finModFile,0,0);
    if ((((uVar1 & 5) != 0) || (seq[0] != '\x1f')) || (seq[1] != -0x75)) {
      seq_1[0] = '\n';
      bVar2 = cmFortranStreamContainsSequence((istream *)&finModFile,seq_1,1);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,compilerId);
        poVar6 = std::operator<<(poVar6," fortran module ");
        poVar6 = std::operator<<(poVar6,modFile);
        poVar6 = std::operator<<(poVar6," has unexpected format.");
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_00462de1;
      }
      bVar2 = cmFortranStreamContainsSequence((istream *)&finStampFile,seq_1,1);
      goto LAB_00462f2d;
    }
  }
  else {
    iVar3 = strcmp(compilerId,"Intel");
    if (iVar3 == 0) {
      seq[0] = '\n';
      seq[1] = '\0';
      bVar2 = cmFortranStreamContainsSequence((istream *)&finModFile,seq,2);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,compilerId);
        poVar6 = std::operator<<(poVar6," fortran module ");
        poVar6 = std::operator<<(poVar6,modFile);
        poVar6 = std::operator<<(poVar6," has unexpected format.");
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_00462de1;
      }
      bVar2 = cmFortranStreamContainsSequence((istream *)&finStampFile,seq,2);
LAB_00462f2d:
      if (bVar2 == false) goto LAB_00462de1;
    }
  }
  while( true ) {
    iVar3 = std::istream::get();
    iVar4 = std::istream::get();
    if ((abStack_410[*(long *)(_finModFile + -0x18)] & 5) != 0) break;
    if ((iVar3 != iVar4) ||
       ((*(uint *)((long)auStack_208 + *(long *)(_finStampFile + -0x18)) & 5) != 0))
    goto LAB_00462de1;
  }
  bVar7 = (*(byte *)((long)auStack_208 + *(long *)(_finStampFile + -0x18)) & 5) == 0;
LAB_00462de1:
  std::ifstream::~ifstream(&finStampFile);
  std::ifstream::~ifstream(&finModFile);
  return bVar7;
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const char* modFile,
                                     const char* stampFile,
                                     const char* compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absoulte path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */


  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if(strcmp(compilerId, "SunPro") == 0)
    {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
    }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile, std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile, std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile, std::ios::in);
  cmsys::ifstream finStampFile(stampFile, std::ios::in);
#endif
  if(!finModFile || !finStampFile)
    {
    // At least one of the files does not exist.  The modules differ.
    return true;
    }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (strcmp(compilerId, "GNU") == 0 )
    {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = finModFile.read(reinterpret_cast<char*>(hdr), 2)? true:false;
    finModFile.seekg(0);
    if(!(okay && hdr[0] == 0x1f && hdr[1] == 0x8b))
      {
      const char seq[1] = {'\n'};
      const int seqlen = 1;

      if(!cmFortranStreamContainsSequence(finModFile, seq, seqlen))
        {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
        }

      if(!cmFortranStreamContainsSequence(finStampFile, seq, seqlen))
        {
        // The stamp must differ if the sequence is not contained.
        return true;
        }
      }
    }
  else if(strcmp(compilerId, "Intel") == 0)
    {
    const char seq[2] = {'\n', '\0'};
    const int seqlen = 2;

    if(!cmFortranStreamContainsSequence(finModFile, seq, seqlen))
      {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
      }

    if(!cmFortranStreamContainsSequence(finStampFile, seq, seqlen))
      {
      // The stamp must differ if the sequence is not contained.
      return true;
      }
    }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  if(!cmFortranStreamsDiffer(finModFile, finStampFile))
    {
    return false;
    }

   // The modules are different.
   return true;
}